

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader::begin__transparent
          (LibraryEffectsLoader *this,transparent__AttributeData *attributeData)

{
  OpaqueMode OVar1;
  
  OVar1 = UNSPECIFIED_OPAQUE;
  if ((ulong)attributeData->opaque < 4) {
    OVar1 = *(OpaqueMode *)(&DAT_00838170 + (ulong)attributeData->opaque * 4);
  }
  this->mOpaqueMode = OVar1;
  this->mCurrentShaderParameterType = SHADER_PARAMETER_TRANSPARENT;
  return true;
}

Assistant:

bool LibraryEffectsLoader::begin__transparent ( const transparent__AttributeData& attributeData )
	{
		ENUM__fx_opaque opaque = attributeData.opaque;
		switch ( opaque )
		{
        case ENUM__fx_opaque__A_ZERO:
            mOpaqueMode = A_ZERO;
            break;
		case ENUM__fx_opaque__A_ONE:
			mOpaqueMode = A_ONE;
			break;
		case ENUM__fx_opaque__RGB_ZERO:
			mOpaqueMode = RGB_ZERO;
			break;
        case ENUM__fx_opaque__RGB_ONE:
            mOpaqueMode = RGB_ONE;
            break;
		default:
			mOpaqueMode = UNSPECIFIED_OPAQUE;
			break;
		}
		mCurrentShaderParameterType = SHADER_PARAMETER_TRANSPARENT; 
		return true;
	}